

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<std::array<bfy_iovec,2ul>,void>
               (array<bfy_iovec,_2UL> *container,ostream *os)

{
  long lVar1;
  
  std::operator<<(os,'{');
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 0x10) {
    if (lVar1 != 0) {
      std::operator<<(os,',');
    }
    std::operator<<(os,' ');
    ::operator<<(os,(bfy_iovec *)((long)&container->_M_elems[0].iov_base + lVar1));
  }
  std::operator<<(os,' ');
  std::operator<<(os,'}');
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }